

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufUncompress
               (char *compressed,int nCompressed,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *raw)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  unsigned_short *__n;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDX;
  int in_ESI;
  char *in_RDI;
  vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> hdec;
  vector<long_long,_std::allocator<long_long>_> freq;
  char *ptr;
  int nBits;
  int iM;
  int im;
  size_type in_stack_fffffffffffffef8;
  vector<long_long,_std::allocator<long_long>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<long_long,_std::allocator<long_long>_> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  int iM_00;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char **in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  HufDec *in_stack_ffffffffffffff90;
  longlong *in_stack_ffffffffffffff98;
  unsigned_short *in_stack_ffffffffffffffb0;
  int local_38;
  int local_10;
  byte local_1;
  
  iM_00 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (in_ESI == 0) {
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(in_RDX);
    if (sVar6 == 0) {
      local_1 = 0;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    uVar2 = readUInt(in_RDI);
    uVar3 = readUInt(in_RDI + 4);
    uVar4 = readUInt(in_RDI + 0xc);
    if (((((int)uVar2 < 0) || (0x10000 < (int)uVar2)) || ((int)uVar3 < 0)) || (0x10000 < (int)uVar3)
       ) {
      local_1 = 0;
    }
    else {
      std::allocator<long_long>::allocator((allocator<long_long> *)0x481bea);
      std::vector<long_long,_std::allocator<long_long>_>::vector
                (in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::allocator<long_long>::~allocator((allocator<long_long> *)0x481c10);
      std::allocator<tinyexr::HufDec>::allocator((allocator<tinyexr::HufDec> *)0x481c22);
      std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::vector
                ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                 in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::allocator<tinyexr::HufDec>::~allocator((allocator<tinyexr::HufDec> *)0x481c48);
      pvVar7 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                         ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                          in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      hufClearDecTable(pvVar7);
      local_38 = (int)(in_RDI + 0x14);
      local_10 = (int)in_RDI;
      iVar5 = in_ESI + (local_10 - local_38);
      std::vector<long_long,_std::allocator<long_long>_>::at
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      hufUnpackEncTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff30,iM_00,(longlong *)in_stack_ffffffffffffff20);
      bVar1 = (long)(int)uVar4 <= ((long)in_ESI - ((long)(in_RDI + 0x14) - (long)in_RDI)) * 8;
      if (bVar1) {
        pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::at
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        pvVar7 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                           ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        hufBuildDecTable((longlong *)CONCAT44(iVar5,in_stack_ffffffffffffff48),
                         (int)((ulong)pvVar8 >> 0x20),(int)pvVar8,pvVar7);
        std::vector<long_long,_std::allocator<long_long>_>::at
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                  ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(in_RDX);
        __n = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x481e64);
        hufDecode(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                  in_stack_ffffffffffffffb0);
        pvVar7 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                           ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                            in_stack_ffffffffffffff00,(size_type)__n);
        hufFreeDecTable(pvVar7);
      }
      else {
        local_1 = 0;
        uVar4 = in_stack_ffffffffffffff14;
      }
      std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::~vector
                ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)
                 CONCAT44(uVar4,in_stack_ffffffffffffff10));
      std::vector<long_long,_std::allocator<long_long>_>::~vector
                ((vector<long_long,_std::allocator<long_long>_> *)
                 CONCAT44(uVar4,in_stack_ffffffffffffff10));
      if (bVar1) {
        local_1 = 1;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool hufUncompress(const char compressed[], int nCompressed,
                          std::vector<unsigned short> *raw) {
  if (nCompressed == 0) {
    if (raw->size() != 0) return false;

    return false;
  }

  int im = readUInt(compressed);
  int iM = readUInt(compressed + 4);
  // int tableLength = readUInt (compressed + 8);
  int nBits = readUInt(compressed + 12);

  if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE) return false;

  const char *ptr = compressed + 20;

  //
  // Fast decoder needs at least 2x64-bits of compressed data, and
  // needs to be run-able on this platform. Otherwise, fall back
  // to the original decoder
  //

  // if (FastHufDecoder::enabled() && nBits > 128)
  //{
  //    FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);
  //    fhd.decode ((unsigned char*)ptr, nBits, raw, nRaw);
  //}
  // else
  {
    std::vector<long long> freq(HUF_ENCSIZE);
    std::vector<HufDec> hdec(HUF_DECSIZE);

    hufClearDecTable(&hdec.at(0));

    hufUnpackEncTable(&ptr, nCompressed - (ptr - compressed), im, iM,
                      &freq.at(0));

    {
      if (nBits > 8 * (nCompressed - (ptr - compressed))) {
        return false;
      }

      hufBuildDecTable(&freq.at(0), im, iM, &hdec.at(0));
      hufDecode(&freq.at(0), &hdec.at(0), ptr, nBits, iM, raw->size(),
                raw->data());
    }
    // catch (...)
    //{
    //    hufFreeDecTable (hdec);
    //    throw;
    //}

    hufFreeDecTable(&hdec.at(0));
  }

  return true;
}